

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

QUnifiedTimer * QUnifiedTimer::instance(bool create)

{
  bool bVar1;
  long lVar2;
  QUnifiedTimer *__p;
  pointer pQVar3;
  byte in_DIL;
  QUnifiedTimer *inst;
  unique_ptr<QUnifiedTimer,_std::default_delete<QUnifiedTimer>_> *in_stack_ffffffffffffffe0;
  QUnifiedTimer *pQVar4;
  
  pQVar4 = (QUnifiedTimer *)&DAT_aaaaaaaaaaaaaaaa;
  lVar2 = __tls_get_addr(&PTR_00bf6270);
  if (*(char *)(lVar2 + 0x70) == '\0') {
    lVar2 = __tls_get_addr(&PTR_00bf6270);
    __cxa_thread_atexit(std::unique_ptr<QUnifiedTimer,_std::default_delete<QUnifiedTimer>_>::
                        ~unique_ptr,lVar2 + 0x68,&__dso_handle);
    lVar2 = __tls_get_addr(&PTR_00bf6270);
    *(undefined1 *)(lVar2 + 0x70) = 1;
  }
  if ((in_DIL & 1) != 0) {
    __tls_get_addr(&PTR_00bf6270);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QUnifiedTimer,_std::default_delete<QUnifiedTimer>_> *)0x668582);
    if (!bVar1) {
      __p = (QUnifiedTimer *)operator_new(0xd0);
      QUnifiedTimer(pQVar4);
      pQVar4 = __p;
      __tls_get_addr(&PTR_00bf6270);
      std::unique_ptr<QUnifiedTimer,_std::default_delete<QUnifiedTimer>_>::reset
                (in_stack_ffffffffffffffe0,__p);
      return pQVar4;
    }
  }
  __tls_get_addr(&PTR_00bf6270);
  pQVar3 = std::unique_ptr<QUnifiedTimer,_std::default_delete<QUnifiedTimer>_>::get
                     (in_stack_ffffffffffffffe0);
  return pQVar3;
}

Assistant:

QUnifiedTimer *QUnifiedTimer::instance(bool create)
{
    QUnifiedTimer *inst;
    static thread_local std::unique_ptr<QUnifiedTimer> unifiedTimer;
    if (create && !unifiedTimer) {
        inst = new QUnifiedTimer;
        unifiedTimer.reset(inst);
    } else {
        inst = unifiedTimer.get();
    }
    return inst;
}